

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

CappedArray<char,_26UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_26UL> *__return_storage_ptr__,Stringifier *this,longlong i)

{
  uint8_t *puVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t reverse [25];
  
  if (i == 0) {
    puVar5 = reverse + 1;
    reverse[0] = '\0';
    pcVar3 = __return_storage_ptr__->content;
  }
  else {
    uVar4 = -i;
    if (0 < i) {
      uVar4 = i;
    }
    puVar5 = reverse;
    do {
      *puVar5 = (char)uVar4 + (char)(uVar4 / 10) * -10;
      puVar5 = puVar5 + 1;
      bVar2 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar2);
    pcVar3 = __return_storage_ptr__->content;
    if (i < 0) {
      pcVar3 = __return_storage_ptr__->content + 1;
      __return_storage_ptr__->content[0] = '-';
    }
    if (puVar5 <= reverse) goto LAB_001fc3e2;
  }
  do {
    puVar1 = puVar5 + -1;
    puVar5 = puVar5 + -1;
    *pcVar3 = *puVar1 + '0';
    pcVar3 = pcVar3 + 1;
  } while (reverse < puVar5);
LAB_001fc3e2:
  __return_storage_ptr__->currentSize = (long)pcVar3 - (long)__return_storage_ptr__->content;
  return __return_storage_ptr__;
}

Assistant:

static CappedArray<char, sizeof(T) * 3 + 2> stringifyImpl(T i) {
  // We don't use sprintf() because it's not async-signal-safe (for strPreallocated()).
  CappedArray<char, sizeof(T) * 3 + 2> result;
  bool negative = i < 0;
  Unsigned u = negative ? -i : i;
  uint8_t reverse[sizeof(T) * 3 + 1];
  uint8_t* p = reverse;
  if (u == 0) {
    *p++ = 0;
  } else {
    while (u > 0) {
      *p++ = u % 10;
      u /= 10;
    }
  }

  char* p2 = result.begin();
  if (negative) *p2++ = '-';
  while (p > reverse) {
    *p2++ = '0' + *--p;
  }
  result.setSize(p2 - result.begin());
  return result;
}